

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

json_object * json_object_new_double(double d)

{
  json_object_double *jso;
  double d_local;
  
  d_local = (double)json_object_new(json_type_double,0x30,json_object_double_to_json_string);
  if ((json_object *)d_local == (json_object *)0x0) {
    d_local = 0.0;
  }
  else {
    ((json_object *)d_local)->_to_json_string = json_object_double_to_json_string_default;
    *(double *)((long)d_local + 0x28) = d;
  }
  return (json_object *)d_local;
}

Assistant:

struct json_object *json_object_new_double(double d)
{
	struct json_object_double *jso = JSON_OBJECT_NEW(double);
	if (!jso)
		return NULL;
	jso->base._to_json_string = &json_object_double_to_json_string_default;
	jso->c_double = d;
	return &jso->base;
}